

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::DeepScanLineOutputFile::Data::~Data(Data *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LineBuffer *this_00;
  pointer pcVar2;
  char *pcVar3;
  uint *puVar4;
  pointer puVar5;
  pointer ppLVar6;
  pointer ppOVar7;
  pointer ppLVar8;
  ulong uVar9;
  
  ppLVar6 = (this->lineBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar8 = (this->lineBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar8 != ppLVar6) {
    uVar9 = 0;
    do {
      this_00 = ppLVar6[uVar9];
      if (this_00 != (LineBuffer *)0x0) {
        if (this_00->compressor != (Compressor *)0x0) {
          (*this_00->compressor->_vptr_Compressor[1])();
        }
        if (this_00->sampleCountTableCompressor != (Compressor *)0x0) {
          (*this_00->sampleCountTableCompressor->_vptr_Compressor[1])();
        }
        IlmThread_3_4::Semaphore::~Semaphore(&this_00->_sem);
        pcVar2 = (this_00->exception)._M_dataplus._M_p;
        paVar1 = &(this_00->exception).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        pcVar3 = (this_00->sampleCountTableBuffer)._data;
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
        pcVar3 = (this_00->consecutiveBuffer)._data;
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
        Array<Imf_3_4::Array<char>_>::~Array(&this_00->buffer);
        operator_delete(this_00,200);
        ppLVar6 = (this->lineBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppLVar8 = (this->lineBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)ppLVar8 - (long)ppLVar6 >> 3));
  }
  ppOVar7 = (this->slices).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppOVar7) {
    uVar9 = 0;
    do {
      operator_delete(ppOVar7[uVar9],0x38);
      uVar9 = uVar9 + 1;
      ppOVar7 = (this->slices).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->slices).
                                   super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar7 >> 3))
    ;
  }
  puVar4 = (this->lineSampleCount)._data;
  if (puVar4 != (uint *)0x0) {
    operator_delete__(puVar4);
  }
  ppLVar6 = (this->lineBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppLVar6 != (pointer)0x0) {
    operator_delete(ppLVar6,(long)(this->lineBuffers).
                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar6
                   );
  }
  ppOVar7 = (this->slices).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar7 != (pointer)0x0) {
    operator_delete(ppOVar7,(long)(this->slices).
                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar7
                   );
  }
  puVar5 = (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->bytesPerLine).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->lineOffsets).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepScanLineOutputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        if (lineBuffers[i] != 0) delete lineBuffers[i];

    for (size_t i = 0; i < slices.size (); i++)
        delete slices[i];
}